

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O0

void __thiscall Table::printState(Table *this)

{
  char cVar1;
  ostream *poVar2;
  int local_54;
  int i_1;
  Cell *j;
  Cell *__end2;
  Cell *__begin2;
  Cell (*__range2) [3];
  Cell (*i) [3];
  Cell (*__end1) [3];
  Cell (*__begin1) [3];
  Cell (*__range1) [3] [3];
  Table *this_local;
  
  for (__end1 = (Cell (*) [3])this; __end1 != (Cell (*) [3])&this->field_0x9; __end1 = __end1 + 1) {
    std::operator<<((ostream *)&std::cout,"|");
    for (__end2 = *__end1; __end2 != __end1[1]; __end2 = __end2 + 1) {
      cVar1 = Cell::getNumber(__end2);
      poVar2 = std::operator<<((ostream *)&std::cout,cVar1);
      std::operator<<(poVar2,"|");
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  for (local_54 = 0; local_54 < 6; local_54 = local_54 + 1) {
    std::operator<<((ostream *)&std::cout,"-");
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Table::printState() {
    for (auto & i : table) {
        std::cout << "|";
        for (auto & j : i) {
            std::cout << j.getNumber() << "|";
        }
        std::cout << std::endl;
    }
    for (int i = 0; i < 2*HEIGHT; i++) {
        std::cout << "-";
    }
    std::cout << std::endl;
}